

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

int __thiscall
cmCTest::RunMakeCommand
          (cmCTest *this,string *command,string *output,int *retVal,char *dir,cmDuration timeout,
          ostream *ofs,Encoding encoding)

{
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  char *pcVar6;
  reference ppcVar7;
  cmsysProcess *cp_00;
  char **command_00;
  ostream *poVar8;
  reference pcVar9;
  ulong uVar10;
  undefined8 uVar11;
  size_t sVar12;
  void *pvVar13;
  rep_conflict timeout_00;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  string local_1670 [32];
  undefined1 local_1650 [8];
  ostringstream cmCTestLog_msg_12;
  string local_14d8 [32];
  undefined1 local_14b8 [8];
  ostringstream cmCTestLog_msg_11;
  string local_1340 [32];
  undefined1 local_1320 [8];
  ostringstream cmCTestLog_msg_10;
  string local_11a8 [32];
  undefined1 local_1188 [8];
  ostringstream cmCTestLog_msg_9;
  string local_1008 [4];
  int result;
  undefined1 local_fe8 [8];
  ostringstream cmCTestLog_msg_8;
  cmCTestLogWrite local_e70;
  string local_e60 [32];
  cmCTestLogWrite local_e40;
  undefined1 local_e30 [8];
  ostringstream cmCTestLog_msg_7;
  string local_cb8;
  cmCTestLogWrite local_c98;
  string local_c88 [32];
  cmCTestLogWrite local_c68;
  undefined1 local_c58 [8];
  ostringstream cmCTestLog_msg_6;
  string local_ae0 [32];
  undefined1 local_ac0 [8];
  ostringstream cmCTestLog_msg_5;
  string local_948 [32];
  undefined1 local_928 [8];
  ostringstream cmCTestLog_msg_4;
  char *cc;
  iterator __end2;
  iterator __begin2;
  string *__range2;
  undefined1 local_770 [8];
  ostringstream cmCTestLog_msg_3;
  undefined1 local_5f8 [8];
  string strdata;
  cmProcessOutput processOutput;
  char *pcStack_5d0;
  int length;
  char *data;
  size_type tick_line_len;
  size_type tick_len;
  size_type tick;
  cmsysProcess *cp;
  ostringstream local_588 [8];
  ostringstream cmCTestLog_msg_2;
  string local_410 [32];
  undefined1 local_3f0 [8];
  ostringstream cmCTestLog_msg_1;
  char *arg;
  iterator __end1_1;
  iterator __begin1_1;
  vector<const_char_*,_std::allocator<const_char_*>_> *__range1_1;
  undefined1 local_238 [8];
  ostringstream cmCTestLog_msg;
  value_type local_c0;
  value_type local_b8;
  reference local_b0;
  string *a;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_80 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  undefined1 local_60 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  ostream *ofs_local;
  char *dir_local;
  int *retVal_local;
  string *output_local;
  string *command_local;
  cmCTest *this_local;
  cmDuration timeout_local;
  
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ofs;
  this_local = (cmCTest *)timeout.__r;
  cmSystemTools::ParseArguments
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_60,command);
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_60);
  if (bVar2) {
    timeout_local.__r._4_4_ = 0;
    argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  else {
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_80);
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_60);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_80,sVar5 + 1);
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_60);
    a = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_60);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&a), bVar2) {
      local_b0 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end1);
      local_b8 = (value_type)std::__cxx11::string::c_str();
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_80,&local_b8);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    local_c0 = (value_type)0x0;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_80,&local_c0);
    std::__cxx11::string::clear();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
    std::operator<<((ostream *)local_238,"Run command:");
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    Log(this,5,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0x444,pcVar6,false);
    std::__cxx11::string::~string((string *)&__range1_1);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
    __end1_1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::begin
                         ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_80);
    arg = (char *)std::vector<const_char_*,_std::allocator<const_char_*>_>::end
                            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_80);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                               *)&arg), bVar2) {
      ppcVar7 = __gnu_cxx::
                __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                ::operator*(&__end1_1);
      pcVar6 = *ppcVar7;
      if (pcVar6 == (char *)0x0) break;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
      poVar8 = std::operator<<((ostream *)local_3f0," \"");
      poVar8 = std::operator<<(poVar8,pcVar6);
      std::operator<<(poVar8,"\"");
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      Log(this,5,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
          ,0x449,pcVar6,false);
      std::__cxx11::string::~string(local_410);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
      __gnu_cxx::
      __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>::
      operator++(&__end1_1);
    }
    std::__cxx11::ostringstream::ostringstream(local_588);
    std::ostream::operator<<(local_588,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    Log(this,5,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,1099,pcVar6,false);
    std::__cxx11::string::~string((string *)&cp);
    std::__cxx11::ostringstream::~ostringstream(local_588);
    cp_00 = cmsysProcess_New();
    command_00 = std::vector<const_char_*,_std::allocator<const_char_*>_>::data
                           ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_80);
    cmsysProcess_SetCommand(cp_00,command_00);
    cmsysProcess_SetWorkingDirectory(cp_00,dir);
    cmsysProcess_SetOption(cp_00,0,1);
    timeout_00 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                           ((duration<double,_std::ratio<1L,_1L>_> *)&this_local);
    cmsysProcess_SetTimeout(cp_00,timeout_00);
    cmsysProcess_Execute(cp_00);
    tick_len = 0;
    cmProcessOutput::cmProcessOutput
              ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),encoding,0x400);
    std::__cxx11::string::string((string *)local_5f8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_770);
    poVar8 = std::operator<<((ostream *)local_770,"   Each . represents ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x400);
    poVar8 = std::operator<<(poVar8," bytes of output\n    ");
    std::ostream::operator<<(poVar8,std::flush<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    Log(this,3,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0x462,pcVar6,false);
    std::__cxx11::string::~string((string *)&__range2);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_770);
    while (iVar3 = cmsysProcess_WaitForData
                             (cp_00,&stack0xfffffffffffffa30,
                              (int *)(strdata.field_2._M_local_buf + 0xc),(double *)0x0), iVar3 != 0
          ) {
      cmProcessOutput::DecodeText
                ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),pcStack_5d0,
                 (long)(int)strdata.field_2._12_4_,(string *)local_5f8,0);
      __end2._M_current = (char *)std::__cxx11::string::begin();
      cc = (char *)std::__cxx11::string::end();
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)&cc), bVar2) {
        pcVar9 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&__end2);
        if (*pcVar9 == '\0') {
          *pcVar9 = '\n';
        }
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end2);
      }
      std::__cxx11::string::append((string *)output);
      while (uVar10 = std::__cxx11::string::size(), tick_len * 0x400 < uVar10) {
        tick_len = tick_len + 1;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_928);
        poVar8 = std::operator<<((ostream *)local_928,".");
        std::ostream::operator<<(poVar8,std::flush<char,std::char_traits<char>>);
        std::__cxx11::ostringstream::str();
        pcVar6 = (char *)std::__cxx11::string::c_str();
        Log(this,3,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
            ,0x46d,pcVar6,false);
        std::__cxx11::string::~string(local_948);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_928);
        if ((tick_len % 0x32 == 0) && (tick_len != 0)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_ac0);
          poVar8 = std::operator<<((ostream *)local_ac0,"  Size: ");
          uVar11 = std::__cxx11::string::size();
          auVar14._8_4_ = (int)((ulong)uVar11 >> 0x20);
          auVar14._0_8_ = uVar11;
          auVar14._12_4_ = 0x45300000;
          poVar8 = (ostream *)
                   std::ostream::operator<<
                             (poVar8,(int)(((auVar14._8_8_ - 1.9342813113834067e+25) +
                                           ((double)CONCAT44(0x43300000,(int)uVar11) -
                                           4503599627370496.0)) * 0.0009765625 + 1.0));
          poVar8 = std::operator<<(poVar8,"K\n    ");
          std::ostream::operator<<(poVar8,std::flush<char,std::char_traits<char>>);
          std::__cxx11::ostringstream::str();
          pcVar6 = (char *)std::__cxx11::string::c_str();
          Log(this,3,
              "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
              ,0x471,pcVar6,false);
          std::__cxx11::string::~string(local_ae0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_ac0);
        }
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c58);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      sVar12 = std::__cxx11::string::size();
      cmCTestLogWrite::cmCTestLogWrite(&local_c68,pcVar6,sVar12);
      ::operator<<((ostream *)local_c58,&local_c68);
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      Log(this,5,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
          ,0x475,pcVar6,false);
      std::__cxx11::string::~string(local_c88);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c58);
      bVar2 = std::ios::operator_cast_to_bool
                        ((ios *)(&(args.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_dataplus
                                + *(long *)(*(long *)args.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + -0x18)));
      pbVar1 = args.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (bVar2) {
        pcVar6 = (char *)std::__cxx11::string::c_str();
        sVar12 = std::__cxx11::string::size();
        cmCTestLogWrite::cmCTestLogWrite(&local_c98,pcVar6,sVar12);
        ::operator<<((ostream *)pbVar1,&local_c98);
      }
    }
    std::__cxx11::string::string((string *)&local_cb8);
    cmProcessOutput::DecodeText
              ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xb),&local_cb8,
               (string *)local_5f8,0);
    std::__cxx11::string::~string((string *)&local_cb8);
    uVar10 = std::__cxx11::string::empty();
    if ((uVar10 & 1) == 0) {
      std::__cxx11::string::append((string *)output);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_e30);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      sVar12 = std::__cxx11::string::size();
      cmCTestLogWrite::cmCTestLogWrite(&local_e40,pcVar6,sVar12);
      ::operator<<((ostream *)local_e30,&local_e40);
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      Log(this,5,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
          ,0x47e,pcVar6,false);
      std::__cxx11::string::~string(local_e60);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_e30);
      bVar2 = std::ios::operator_cast_to_bool
                        ((ios *)(&(args.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_dataplus
                                + *(long *)(*(long *)args.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + -0x18)));
      pbVar1 = args.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (bVar2) {
        pcVar6 = (char *)std::__cxx11::string::c_str();
        sVar12 = std::__cxx11::string::size();
        cmCTestLogWrite::cmCTestLogWrite(&local_e70,pcVar6,sVar12);
        ::operator<<((ostream *)pbVar1,&local_e70);
      }
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_fe8);
    poVar8 = std::operator<<((ostream *)local_fe8," Size of output: ");
    uVar11 = std::__cxx11::string::size();
    auVar15._8_4_ = (int)((ulong)uVar11 >> 0x20);
    auVar15._0_8_ = uVar11;
    auVar15._12_4_ = 0x45300000;
    poVar8 = (ostream *)
             std::ostream::operator<<
                       (poVar8,(int)(((auVar15._8_8_ - 1.9342813113834067e+25) +
                                     ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0)
                                     ) * 0.0009765625));
    poVar8 = std::operator<<(poVar8,"K");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    Log(this,3,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0x485,pcVar6,false);
    std::__cxx11::string::~string(local_1008);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_fe8);
    cmsysProcess_WaitForExit(cp_00,(double *)0x0);
    iVar3 = cmsysProcess_GetState(cp_00);
    if (iVar3 == 4) {
      iVar4 = cmsysProcess_GetExitValue(cp_00);
      *retVal = iVar4;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1188);
      poVar8 = std::operator<<((ostream *)local_1188,"Command exited with the value: ");
      pvVar13 = (void *)std::ostream::operator<<(poVar8,*retVal);
      std::ostream::operator<<(pvVar13,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      Log(this,5,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
          ,0x48e,pcVar6,false);
      std::__cxx11::string::~string(local_11a8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1188);
    }
    else if (iVar3 == 2) {
      iVar4 = cmsysProcess_GetExitException(cp_00);
      *retVal = iVar4;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1320);
      poVar8 = std::operator<<((ostream *)local_1320,"There was an exception: ");
      pvVar13 = (void *)std::ostream::operator<<(poVar8,*retVal);
      std::ostream::operator<<(pvVar13,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      Log(this,6,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
          ,0x492,pcVar6,false);
      std::__cxx11::string::~string(local_1340);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1320);
    }
    else if (iVar3 == 5) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_14b8);
      poVar8 = std::operator<<((ostream *)local_14b8,"There was a timeout");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      Log(this,6,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
          ,0x494,pcVar6,false);
      std::__cxx11::string::~string(local_14d8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_14b8);
    }
    else if (iVar3 == 1) {
      std::__cxx11::string::operator+=((string *)output,"\n*** ERROR executing: ");
      pcVar6 = cmsysProcess_GetErrorString(cp_00);
      std::__cxx11::string::operator+=((string *)output,pcVar6);
      std::__cxx11::string::operator+=((string *)output,"\n***The build process failed.");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1650);
      poVar8 = std::operator<<((ostream *)local_1650,"There was an error: ");
      pcVar6 = cmsysProcess_GetErrorString(cp_00);
      poVar8 = std::operator<<(poVar8,pcVar6);
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      Log(this,7,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
          ,0x49b,pcVar6,false);
      std::__cxx11::string::~string(local_1670);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1650);
    }
    cmsysProcess_Delete(cp_00);
    argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    timeout_local.__r._4_4_ = iVar3;
    std::__cxx11::string::~string((string *)local_5f8);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_80);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_60);
  return timeout_local.__r._4_4_;
}

Assistant:

int cmCTest::RunMakeCommand(const std::string& command, std::string& output,
                            int* retVal, const char* dir, cmDuration timeout,
                            std::ostream& ofs, Encoding encoding)
{
  // First generate the command and arguments
  std::vector<std::string> args = cmSystemTools::ParseArguments(command);

  if (args.empty()) {
    return false;
  }

  std::vector<const char*> argv;
  argv.reserve(args.size() + 1);
  for (std::string const& a : args) {
    argv.push_back(a.c_str());
  }
  argv.push_back(nullptr);

  output.clear();
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, "Run command:");
  for (char const* arg : argv) {
    if (!arg) {
      break;
    }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, " \"" << arg << "\"");
  }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, std::endl);

  // Now create process object
  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, argv.data());
  cmsysProcess_SetWorkingDirectory(cp, dir);
  cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  cmsysProcess_SetTimeout(cp, timeout.count());
  cmsysProcess_Execute(cp);

  // Initialize tick's
  std::string::size_type tick = 0;
  std::string::size_type tick_len = 1024;
  std::string::size_type tick_line_len = 50;

  char* data;
  int length;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  cmCTestLog(this, HANDLER_PROGRESS_OUTPUT,
             "   Each . represents " << tick_len
                                     << " bytes of output\n"
                                        "    "
                                     << std::flush);
  while (cmsysProcess_WaitForData(cp, &data, &length, nullptr)) {
    processOutput.DecodeText(data, length, strdata);
    for (char& cc : strdata) {
      if (cc == 0) {
        cc = '\n';
      }
    }
    output.append(strdata);
    while (output.size() > (tick * tick_len)) {
      tick++;
      cmCTestLog(this, HANDLER_PROGRESS_OUTPUT, "." << std::flush);
      if (tick % tick_line_len == 0 && tick > 0) {
        cmCTestLog(this, HANDLER_PROGRESS_OUTPUT,
                   "  Size: " << int((double(output.size()) / 1024.0) + 1)
                              << "K\n    " << std::flush);
      }
    }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               cmCTestLogWrite(strdata.c_str(), strdata.size()));
    if (ofs) {
      ofs << cmCTestLogWrite(strdata.c_str(), strdata.size());
    }
  }
  processOutput.DecodeText(std::string(), strdata);
  if (!strdata.empty()) {
    output.append(strdata);
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               cmCTestLogWrite(strdata.c_str(), strdata.size()));
    if (ofs) {
      ofs << cmCTestLogWrite(strdata.c_str(), strdata.size());
    }
  }
  cmCTestLog(this, HANDLER_PROGRESS_OUTPUT,
             " Size of output: " << int(double(output.size()) / 1024.0) << "K"
                                 << std::endl);

  cmsysProcess_WaitForExit(cp, nullptr);

  int result = cmsysProcess_GetState(cp);

  if (result == cmsysProcess_State_Exited) {
    *retVal = cmsysProcess_GetExitValue(cp);
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               "Command exited with the value: " << *retVal << std::endl);
  } else if (result == cmsysProcess_State_Exception) {
    *retVal = cmsysProcess_GetExitException(cp);
    cmCTestLog(this, WARNING,
               "There was an exception: " << *retVal << std::endl);
  } else if (result == cmsysProcess_State_Expired) {
    cmCTestLog(this, WARNING, "There was a timeout" << std::endl);
  } else if (result == cmsysProcess_State_Error) {
    output += "\n*** ERROR executing: ";
    output += cmsysProcess_GetErrorString(cp);
    output += "\n***The build process failed.";
    cmCTestLog(this, ERROR_MESSAGE,
               "There was an error: " << cmsysProcess_GetErrorString(cp)
                                      << std::endl);
  }

  cmsysProcess_Delete(cp);

  return result;
}